

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(TasmanianSparseGrid *this)

{
  TasmanianSparseGrid *this_local;
  
  Utils::make_unique<TasGrid::AccelerationContext>();
  ::std::unique_ptr<TasGrid::BaseCanonicalGrid,std::default_delete<TasGrid::BaseCanonicalGrid>>::
  unique_ptr<std::default_delete<TasGrid::BaseCanonicalGrid>,void>
            ((unique_ptr<TasGrid::BaseCanonicalGrid,std::default_delete<TasGrid::BaseCanonicalGrid>>
              *)&this->base);
  ::std::vector<double,_std::allocator<double>_>::vector(&this->domain_transform_a);
  ::std::vector<double,_std::allocator<double>_>::vector(&this->domain_transform_b);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->conformal_asin_power);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->llimits);
  this->using_dynamic_construction = false;
  ::std::
  unique_ptr<TasGrid::AccelerationDomainTransform,std::default_delete<TasGrid::AccelerationDomainTransform>>
  ::unique_ptr<std::default_delete<TasGrid::AccelerationDomainTransform>,void>
            ((unique_ptr<TasGrid::AccelerationDomainTransform,std::default_delete<TasGrid::AccelerationDomainTransform>>
              *)&this->acc_domain);
  return;
}

Assistant:

TasmanianSparseGrid::TasmanianSparseGrid() : acceleration(Utils::make_unique<AccelerationContext>()), using_dynamic_construction(false){}